

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * Fantasy_Movie_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  ulong *puVar1;
  byte bVar2;
  int iVar3;
  flatcc_builder_ref_t fVar4;
  size_t n_1;
  char *pcVar5;
  ulong uVar6;
  flatcc_json_parser_integral_symbol_f **type_parsers;
  ulong uVar7;
  ulong uVar8;
  uint uVar10;
  size_t sVar9;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  flatbuffers_voffset_t fVar15;
  ulong uVar16;
  uint uVar17;
  ulong *puVar18;
  byte *pbVar19;
  ulong *puVar20;
  size_t h_unions;
  int more;
  
  *result = 0;
  iVar3 = flatcc_builder_start_table(ctx->ctx,10);
  if ((iVar3 != 0) ||
     (pcVar5 = flatcc_json_parser_prepare_unions(ctx,buf,end,5,&h_unions), pcVar5 == end))
  goto LAB_00117240;
  if ((buf == end) || (*buf != '{')) {
    more = 0;
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
  }
  else {
    puVar18 = (ulong *)(buf + 1);
    if ((long)end - (long)puVar18 < 2) {
LAB_001172db:
      puVar18 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar18,end);
    }
    else if ((char)(byte)*puVar18 < '!') {
      if (((byte)*puVar18 != 0x20) || (buf[2] < '!')) goto LAB_001172db;
      puVar18 = (ulong *)(buf + 2);
    }
    if ((puVar18 == (ulong *)end) || ((byte)*puVar18 != 0x7d)) {
      more = 1;
      goto LAB_00117345;
    }
    more = 0;
    buf = (char *)((long)puVar18 + 1);
    if ((long)end - (long)buf < 2) {
LAB_00118541:
      buf = flatcc_json_parser_space_ext(ctx,buf,end);
      while (puVar18 = (ulong *)buf, more != 0) {
LAB_00117345:
        if (puVar18 != (ulong *)end) {
          if ((byte)*puVar18 == 0x2e) {
            puVar18 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar18,end,5);
          }
          else if ((byte)*puVar18 == 0x22) {
            puVar18 = (ulong *)((long)puVar18 + 1);
            ctx->unquoted = 0;
          }
          else {
            ctx->unquoted = 1;
          }
        }
        uVar7 = (long)end - (long)puVar18;
        puVar20 = puVar18;
        if (uVar7 < 8) {
          uVar11 = 0;
          uVar8 = 0;
          uVar12 = 0;
          uVar14 = 0;
          uVar16 = 0;
          uVar6 = 0;
          switch(uVar7) {
          case 7:
            uVar11 = (long)(char)*(byte *)((long)puVar18 + 6) << 8;
          case 6:
            uVar8 = (long)(char)*(byte *)((long)puVar18 + 5) << 0x10 | uVar11;
          case 5:
            uVar12 = (long)(char)*(byte *)((long)puVar18 + 4) << 0x18 | uVar8;
          case 4:
            uVar14 = (long)(char)*(byte *)((long)puVar18 + 3) << 0x20 | uVar12;
          case 3:
            uVar16 = (long)(char)*(byte *)((long)puVar18 + 2) << 0x28 | uVar14;
          case 2:
            uVar6 = (long)(char)*(byte *)((long)puVar18 + 1) << 0x30 | uVar16;
          case 1:
            uVar6 = (ulong)(byte)*puVar18 << 0x38 | uVar6;
            goto LAB_00117419;
          }
          goto switchD_00117597_default;
        }
        uVar8 = *puVar18;
        uVar6 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
LAB_00117419:
        if (uVar6 < 0x6368617261637465) {
          if (uVar6 == 0x63616d656f5f7479) {
            puVar1 = puVar18 + 1;
            uVar7 = (long)end - (long)puVar1;
            puVar20 = puVar1;
            if (uVar7 < 8) {
              uVar11 = 0;
              uVar8 = 0;
              uVar12 = 0;
              uVar14 = 0;
              uVar16 = 0;
              uVar6 = 0;
              switch(uVar7) {
              case 7:
                uVar11 = (long)(char)*(byte *)((long)puVar18 + 0xe) << 8;
              case 6:
                uVar8 = (long)(char)*(byte *)((long)puVar18 + 0xd) << 0x10 | uVar11;
              case 5:
                uVar12 = (long)(char)*(byte *)((long)puVar18 + 0xc) << 0x18 | uVar8;
              case 4:
                uVar14 = (long)(char)*(byte *)((long)puVar18 + 0xb) << 0x20 | uVar12;
              case 3:
                uVar16 = (long)(char)*(byte *)((long)puVar18 + 10) << 0x28 | uVar14;
              case 2:
                uVar6 = (long)(char)*(byte *)((long)puVar18 + 9) << 0x30 | uVar16;
              case 1:
                uVar6 = (ulong)(byte)*puVar1 << 0x38 | uVar6;
                break;
              default:
                goto switchD_00117597_default;
              }
            }
            else {
              uVar6 = (*puVar1 & 0xff00) << 0x28 | *puVar1 << 0x38;
            }
            if (((uVar6 & 0xffff000000000000) == 0x7065000000000000) && (2 < (long)uVar7)) {
              bVar2 = *(byte *)((long)puVar18 + 10);
              if (ctx->unquoted == 0) {
                if (bVar2 == 0x22) {
                  pbVar19 = (byte *)((long)puVar18 + 0xb);
                  goto LAB_00117c35;
                }
              }
              else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                pbVar19 = (byte *)((long)puVar18 + 10);
                ctx->unquoted = 0;
LAB_00117c35:
                if ((long)end - (long)pbVar19 < 2) {
LAB_00117d3e:
                  pbVar19 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar19,end);
                }
                else if ((char)*pbVar19 < '!') {
                  if ((*pbVar19 != 0x20) || ((char)pbVar19[1] < '!')) goto LAB_00117d3e;
                  pbVar19 = pbVar19 + 1;
                }
                if ((pbVar19 == (byte *)end) || (*pbVar19 != 0x3a)) {
                  puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar19,end,4);
                }
                else {
                  puVar20 = (ulong *)(pbVar19 + 1);
                  if ((long)end - (long)puVar20 < 2) {
LAB_001180b9:
                    puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                  }
                  else if ((char)(byte)*puVar20 < '!') {
                    if (((byte)*puVar20 != 0x20) || ((char)pbVar19[2] < '!')) goto LAB_001180b9;
                    puVar20 = (ulong *)(pbVar19 + 2);
                  }
                }
                if (puVar1 != puVar20) {
                  sVar9 = 3;
                  fVar15 = 7;
                  type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers_1;
LAB_001184ca:
                  pcVar5 = flatcc_json_parser_union_type
                                     (ctx,(char *)puVar20,end,sVar9,fVar15,h_unions,type_parsers,
                                      Fantasy_Character_parse_json_union);
                  goto LAB_001184e7;
                }
              }
            }
            goto switchD_00117597_default;
          }
          if (uVar6 == 0x616e7461676f6e69) {
            puVar1 = puVar18 + 1;
            uVar7 = (long)end - (long)puVar1;
            puVar20 = puVar1;
            if (uVar7 < 8) {
              uVar11 = 0;
              uVar8 = 0;
              uVar12 = 0;
              uVar14 = 0;
              uVar16 = 0;
              uVar6 = 0;
              switch(uVar7) {
              case 7:
                uVar11 = (long)(char)*(byte *)((long)puVar18 + 0xe) << 8;
              case 6:
                uVar8 = (long)(char)*(byte *)((long)puVar18 + 0xd) << 0x10 | uVar11;
              case 5:
                uVar12 = (long)(char)*(byte *)((long)puVar18 + 0xc) << 0x18 | uVar8;
              case 4:
                uVar14 = (long)(char)*(byte *)((long)puVar18 + 0xb) << 0x20 | uVar12;
              case 3:
                uVar16 = (long)(char)*(byte *)((long)puVar18 + 10) << 0x28 | uVar14;
              case 2:
                uVar6 = (long)(char)*(byte *)((long)puVar18 + 9) << 0x30 | uVar16;
              case 1:
                uVar6 = (ulong)(byte)*puVar1 << 0x38 | uVar6;
                break;
              default:
                goto switchD_00117597_default;
              }
            }
            else {
              uVar8 = *puVar1;
              uVar6 = (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
                      (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 |
                      (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            }
            if (uVar6 == 0x73745f7479706500) {
              if (7 < (long)uVar7) {
                bVar2 = *(byte *)((long)puVar18 + 0xf);
                if (ctx->unquoted == 0) {
                  if (bVar2 == 0x22) {
                    puVar18 = puVar18 + 2;
                    goto LAB_00117bf5;
                  }
                }
                else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                  puVar18 = (ulong *)((long)puVar18 + 0xf);
                  ctx->unquoted = 0;
LAB_00117bf5:
                  if ((long)end - (long)puVar18 < 2) {
LAB_00117ccf:
                    puVar18 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar18,end);
                  }
                  else if ((char)(byte)*puVar18 < '!') {
                    if (((byte)*puVar18 != 0x20) || ((char)*(byte *)((long)puVar18 + 1) < '!'))
                    goto LAB_00117ccf;
                    puVar18 = (ulong *)((long)puVar18 + 1);
                  }
                  if ((puVar18 == (ulong *)end) || ((byte)*puVar18 != 0x3a)) {
                    puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar18,end,4);
                  }
                  else {
                    puVar20 = (ulong *)((long)puVar18 + 1);
                    if ((long)end - (long)puVar20 < 2) {
LAB_00118075:
                      puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                    }
                    else if ((char)*(byte *)puVar20 < '!') {
                      if ((*(byte *)puVar20 != 0x20) || ((char)*(byte *)((long)puVar18 + 2) < '!'))
                      goto LAB_00118075;
                      puVar20 = (ulong *)((long)puVar18 + 2);
                    }
                  }
                  if (puVar1 != puVar20) {
                    sVar9 = 1;
                    fVar15 = 3;
                    type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers;
                    goto LAB_001184ca;
                  }
                }
              }
            }
            else if (((uVar6 & 0xffff000000000000) == 0x7374000000000000) && (2 < (long)uVar7)) {
              bVar2 = *(byte *)((long)puVar18 + 10);
              if (ctx->unquoted == 0) {
                if (bVar2 == 0x22) {
                  pbVar19 = (byte *)((long)puVar18 + 0xb);
                  goto LAB_00117e55;
                }
              }
              else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                pbVar19 = (byte *)((long)puVar18 + 10);
                ctx->unquoted = 0;
LAB_00117e55:
                if ((long)end - (long)pbVar19 < 2) {
LAB_00117eae:
                  pbVar19 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar19,end);
                }
                else if ((char)*pbVar19 < '!') {
                  if ((*pbVar19 != 0x20) || ((char)pbVar19[1] < '!')) goto LAB_00117eae;
                  pbVar19 = pbVar19 + 1;
                }
                if ((pbVar19 == (byte *)end) || (*pbVar19 != 0x3a)) {
                  puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar19,end,4);
                }
                else {
                  puVar20 = (ulong *)(pbVar19 + 1);
                  if ((long)end - (long)puVar20 < 2) {
LAB_00118364:
                    puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                  }
                  else if ((char)(byte)*puVar20 < '!') {
                    if (((byte)*puVar20 != 0x20) || ((char)pbVar19[2] < '!')) goto LAB_00118364;
                    puVar20 = (ulong *)(pbVar19 + 2);
                  }
                }
                if (puVar1 != puVar20) {
                  sVar9 = 1;
                  fVar15 = 3;
                  goto LAB_00118058;
                }
              }
            }
            goto switchD_00117597_default;
          }
          if ((uVar6 & 0x7fffffffff000000) != 0x63616d656f000000) goto switchD_00117597_default;
          if (5 < (long)uVar7) {
            bVar2 = *(byte *)((long)puVar18 + 5);
            if (ctx->unquoted == 0) {
              if (bVar2 == 0x22) {
                pbVar19 = (byte *)((long)puVar18 + 6);
                goto LAB_00117bb8;
              }
            }
            else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
              pbVar19 = (byte *)((long)puVar18 + 5);
              ctx->unquoted = 0;
LAB_00117bb8:
              if ((long)end - (long)pbVar19 < 2) {
LAB_00117c69:
                pbVar19 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar19,end);
              }
              else if ((char)*pbVar19 < '!') {
                if ((*pbVar19 != 0x20) || ((char)pbVar19[1] < '!')) goto LAB_00117c69;
                pbVar19 = pbVar19 + 1;
              }
              if ((pbVar19 == (byte *)end) || (*pbVar19 != 0x3a)) {
                puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar19,end,4);
              }
              else {
                puVar20 = (ulong *)(pbVar19 + 1);
                if ((long)end - (long)puVar20 < 2) {
LAB_00118028:
                  puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                }
                else if ((char)(byte)*puVar20 < '!') {
                  if (((byte)*puVar20 != 0x20) || ((char)pbVar19[2] < '!')) goto LAB_00118028;
                  puVar20 = (ulong *)(pbVar19 + 2);
                }
              }
            }
          }
          if (puVar18 == puVar20) goto switchD_00117597_default;
          sVar9 = 3;
          fVar15 = 7;
LAB_00118058:
          pcVar5 = flatcc_json_parser_union
                             (ctx,(char *)puVar20,end,sVar9,fVar15,h_unions,
                              Fantasy_Character_parse_json_union);
        }
        else {
          if (uVar6 < 0x6d61696e5f636861) {
            if (uVar6 == 0x6368617261637465) {
              puVar1 = puVar18 + 1;
              uVar7 = (long)end - (long)puVar1;
              puVar20 = puVar1;
              if (uVar7 < 8) {
                uVar11 = 0;
                uVar8 = 0;
                uVar12 = 0;
                uVar14 = 0;
                uVar16 = 0;
                uVar6 = 0;
                switch(uVar7) {
                case 7:
                  uVar11 = (long)(char)*(byte *)((long)puVar18 + 0xe) << 8;
                case 6:
                  uVar8 = (long)(char)*(byte *)((long)puVar18 + 0xd) << 0x10 | uVar11;
                case 5:
                  uVar12 = (long)(char)*(byte *)((long)puVar18 + 0xc) << 0x18 | uVar8;
                case 4:
                  uVar14 = (long)(char)*(byte *)((long)puVar18 + 0xb) << 0x20 | uVar12;
                case 3:
                  uVar16 = (long)(char)*(byte *)((long)puVar18 + 10) << 0x28 | uVar14;
                case 2:
                  uVar6 = (long)(char)*(byte *)((long)puVar18 + 9) << 0x30 | uVar16;
                case 1:
                  uVar6 = (ulong)(byte)*puVar1 << 0x38 | uVar6;
                  break;
                default:
                  goto switchD_00117597_default;
                }
              }
              else {
                uVar8 = *puVar1;
                uVar6 = (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
                        (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 |
                        (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              }
              if (uVar6 == 0x72735f7479706500) {
                if (7 < (long)uVar7) {
                  bVar2 = *(byte *)((long)puVar18 + 0xf);
                  if (ctx->unquoted == 0) {
                    if (bVar2 == 0x22) {
                      puVar18 = puVar18 + 2;
                      goto LAB_00117db9;
                    }
                  }
                  else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                    puVar18 = (ulong *)((long)puVar18 + 0xf);
                    ctx->unquoted = 0;
LAB_00117db9:
                    if ((long)end - (long)puVar18 < 2) {
LAB_00117dda:
                      puVar18 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar18,end);
                    }
                    else if ((char)(byte)*puVar18 < '!') {
                      if (((byte)*puVar18 != 0x20) || ((char)*(byte *)((long)puVar18 + 1) < '!'))
                      goto LAB_00117dda;
                      puVar18 = (ulong *)((long)puVar18 + 1);
                    }
                    if ((puVar18 == (ulong *)end) || ((byte)*puVar18 != 0x3a)) {
                      puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar18,end,4);
                    }
                    else {
                      puVar20 = (ulong *)((long)puVar18 + 1);
                      if ((long)end - (long)puVar20 < 2) {
LAB_0011830a:
                        puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                      }
                      else if ((char)*(byte *)puVar20 < '!') {
                        if ((*(byte *)puVar20 != 0x20) || ((char)*(byte *)((long)puVar18 + 2) < '!')
                           ) goto LAB_0011830a;
                        puVar20 = (ulong *)((long)puVar18 + 2);
                      }
                    }
                    if (puVar1 != puVar20) {
                      pcVar5 = flatcc_json_parser_union_type_vector
                                         (ctx,(char *)puVar20,end,4,9,h_unions,
                                          Fantasy_Movie_parse_json_table::symbolic_parsers_2,
                                          Fantasy_Character_parse_json_union,
                                          Fantasy_Character_json_union_accept_type);
                      goto LAB_001184e7;
                    }
                  }
                }
              }
              else if (((uVar6 & 0xffff000000000000) == 0x7273000000000000) && (2 < (long)uVar7)) {
                bVar2 = *(byte *)((long)puVar18 + 10);
                if (ctx->unquoted == 0) {
                  if (bVar2 == 0x22) {
                    pbVar19 = (byte *)((long)puVar18 + 0xb);
                    goto LAB_00117f98;
                  }
                }
                else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                  pbVar19 = (byte *)((long)puVar18 + 10);
                  ctx->unquoted = 0;
LAB_00117f98:
                  if ((long)end - (long)pbVar19 < 2) {
LAB_00117fb9:
                    pbVar19 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar19,end);
                  }
                  else if ((char)*pbVar19 < '!') {
                    if ((*pbVar19 != 0x20) || ((char)pbVar19[1] < '!')) goto LAB_00117fb9;
                    pbVar19 = pbVar19 + 1;
                  }
                  if ((pbVar19 == (byte *)end) || (*pbVar19 != 0x3a)) {
                    puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar19,end,4);
                  }
                  else {
                    puVar20 = (ulong *)(pbVar19 + 1);
                    if ((long)end - (long)puVar20 < 2) {
LAB_001183e1:
                      puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                    }
                    else if ((char)(byte)*puVar20 < '!') {
                      if (((byte)*puVar20 != 0x20) || ((char)pbVar19[2] < '!')) goto LAB_001183e1;
                      puVar20 = (ulong *)(pbVar19 + 2);
                    }
                  }
                  if (puVar1 != puVar20) {
                    pcVar5 = flatcc_json_parser_union_vector
                                       (ctx,(char *)puVar20,end,4,9,h_unions,
                                        Fantasy_Character_parse_json_union);
                    goto LAB_001184e7;
                  }
                }
              }
            }
          }
          else if (uVar6 == 0x736964655f6b6963) {
            puVar1 = puVar18 + 1;
            uVar7 = (long)end - (long)puVar1;
            puVar20 = puVar1;
            if (uVar7 < 8) {
              uVar11 = 0;
              uVar8 = 0;
              uVar12 = 0;
              uVar14 = 0;
              uVar16 = 0;
              uVar6 = 0;
              switch(uVar7) {
              case 7:
                uVar11 = (long)(char)*(byte *)((long)puVar18 + 0xe) << 8;
              case 6:
                uVar8 = (long)(char)*(byte *)((long)puVar18 + 0xd) << 0x10 | uVar11;
              case 5:
                uVar12 = (long)(char)*(byte *)((long)puVar18 + 0xc) << 0x18 | uVar8;
              case 4:
                uVar14 = (long)(char)*(byte *)((long)puVar18 + 0xb) << 0x20 | uVar12;
              case 3:
                uVar16 = (long)(char)*(byte *)((long)puVar18 + 10) << 0x28 | uVar14;
              case 2:
                uVar6 = (long)(char)*(byte *)((long)puVar18 + 9) << 0x30 | uVar16;
              case 1:
                uVar6 = (ulong)(byte)*puVar1 << 0x38 | uVar6;
                break;
              default:
                goto switchD_00117597_default;
              }
            }
            else {
              uVar8 = *puVar1;
              uVar6 = (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            }
            if (uVar6 >> 0x10 == 0x6b5f74797065) {
              if (6 < (long)uVar7) {
                bVar2 = *(byte *)((long)puVar18 + 0xe);
                if (ctx->unquoted == 0) {
                  if (bVar2 == 0x22) {
                    pbVar19 = (byte *)((long)puVar18 + 0xf);
                    goto LAB_00117e82;
                  }
                }
                else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                  pbVar19 = (byte *)((long)puVar18 + 0xe);
                  ctx->unquoted = 0;
LAB_00117e82:
                  if ((long)end - (long)pbVar19 < 2) {
LAB_00117f1d:
                    pbVar19 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar19,end);
                  }
                  else if ((char)*pbVar19 < '!') {
                    if ((*pbVar19 != 0x20) || ((char)pbVar19[1] < '!')) goto LAB_00117f1d;
                    pbVar19 = pbVar19 + 1;
                  }
                  if ((pbVar19 == (byte *)end) || (*pbVar19 != 0x3a)) {
                    puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar19,end,4);
                  }
                  else {
                    puVar20 = (ulong *)(pbVar19 + 1);
                    if ((long)end - (long)puVar20 < 2) {
LAB_0011839d:
                      puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                    }
                    else if ((char)(byte)*puVar20 < '!') {
                      if (((byte)*puVar20 != 0x20) || ((char)pbVar19[2] < '!')) goto LAB_0011839d;
                      puVar20 = (ulong *)(pbVar19 + 2);
                    }
                  }
                  if (puVar1 != puVar20) {
                    sVar9 = 2;
                    fVar15 = 5;
                    type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers_4;
                    goto LAB_001184ca;
                  }
                }
              }
            }
            else if (((char)(uVar6 >> 0x38) == 'k') && (1 < (long)uVar7)) {
              bVar2 = *(byte *)((long)puVar18 + 9);
              if (ctx->unquoted == 0) {
                if (bVar2 == 0x22) {
                  pbVar19 = (byte *)((long)puVar18 + 10);
                  goto LAB_00118149;
                }
              }
              else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                pbVar19 = (byte *)((long)puVar18 + 9);
                ctx->unquoted = 0;
LAB_00118149:
                if ((long)end - (long)pbVar19 < 2) {
LAB_0011822c:
                  pbVar19 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar19,end);
                }
                else if ((char)*pbVar19 < '!') {
                  if ((*pbVar19 != 0x20) || ((char)pbVar19[1] < '!')) goto LAB_0011822c;
                  pbVar19 = pbVar19 + 1;
                }
                if ((pbVar19 == (byte *)end) || (*pbVar19 != 0x3a)) {
                  puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar19,end,4);
                }
                else {
                  puVar20 = (ulong *)(pbVar19 + 1);
                  if ((long)end - (long)puVar20 < 2) {
LAB_0011845d:
                    puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                  }
                  else if ((char)(byte)*puVar20 < '!') {
                    if (((byte)*puVar20 != 0x20) || ((char)pbVar19[2] < '!')) goto LAB_0011845d;
                    puVar20 = (ulong *)(pbVar19 + 2);
                  }
                }
                if (puVar1 != puVar20) {
                  sVar9 = 2;
                  fVar15 = 5;
                  goto LAB_00118058;
                }
              }
            }
          }
          else if (uVar6 == 0x6d61696e5f636861) {
            puVar1 = puVar18 + 1;
            uVar7 = (long)end - (long)puVar1;
            puVar20 = puVar1;
            if (uVar7 < 8) {
              uVar11 = 0;
              uVar8 = 0;
              uVar12 = 0;
              uVar14 = 0;
              uVar16 = 0;
              uVar6 = 0;
              switch(uVar7) {
              case 7:
                uVar11 = (long)(char)*(byte *)((long)puVar18 + 0xe) << 8;
              case 6:
                uVar8 = (long)(char)*(byte *)((long)puVar18 + 0xd) << 0x10 | uVar11;
              case 5:
                uVar12 = (long)(char)*(byte *)((long)puVar18 + 0xc) << 0x18 | uVar8;
              case 4:
                uVar14 = (long)(char)*(byte *)((long)puVar18 + 0xb) << 0x20 | uVar12;
              case 3:
                uVar16 = (long)(char)*(byte *)((long)puVar18 + 10) << 0x28 | uVar14;
              case 2:
                uVar6 = (long)(char)*(byte *)((long)puVar18 + 9) << 0x30 | uVar16;
              case 1:
                uVar6 = (ulong)(byte)*puVar1 << 0x38 | uVar6;
                break;
              default:
                goto switchD_00117597_default;
              }
            }
            else {
              uVar8 = *puVar1;
              uVar6 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
            }
            if (uVar6 == 0x7261637465725f74) {
              puVar1 = puVar18 + 2;
              uVar7 = (long)end - (long)puVar1;
              puVar20 = puVar1;
              if (uVar7 < 8) {
                uVar13 = 0;
                uVar17 = 0;
                uVar10 = 0;
                switch(uVar7) {
                case 7:
                case 6:
                case 5:
                case 4:
                  uVar13 = (uint)(char)*(byte *)((long)puVar18 + 0x13);
                case 3:
                  uVar17 = (uint)((ulong)((long)(char)*(byte *)((long)puVar18 + 0x12) << 0x28) >>
                                 0x20) | uVar13;
                case 2:
                  uVar10 = (uint)((ulong)((long)(char)*(byte *)((long)puVar18 + 0x11) << 0x30) >>
                                 0x20) | uVar17;
                case 1:
                  uVar10 = (uint)(((ulong)(byte)*puVar1 << 0x38) >> 0x20) | uVar10;
                  break;
                default:
                  goto switchD_00117597_default;
                }
              }
              else {
                uVar8 = *puVar1;
                uVar10 = (uint)(uVar8 >> 8) & 0xff00 | (uint)(((uVar8 & 0xff00) << 0x28) >> 0x20) |
                         (uint)((uVar8 << 0x38) >> 0x20);
              }
              if ((uVar10 >> 8 == 0x797065) && (3 < (long)uVar7)) {
                bVar2 = *(byte *)((long)puVar18 + 0x13);
                if (ctx->unquoted == 0) {
                  if (bVar2 == 0x22) {
                    pbVar19 = (byte *)((long)puVar18 + 0x14);
                    goto LAB_00118189;
                  }
                }
                else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                  pbVar19 = (byte *)((long)puVar18 + 0x13);
                  ctx->unquoted = 0;
LAB_00118189:
                  if ((long)end - (long)pbVar19 < 2) {
LAB_0011829b:
                    pbVar19 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar19,end);
                  }
                  else if ((char)*pbVar19 < '!') {
                    if ((*pbVar19 != 0x20) || ((char)pbVar19[1] < '!')) goto LAB_0011829b;
                    pbVar19 = pbVar19 + 1;
                  }
                  if ((pbVar19 == (byte *)end) || (*pbVar19 != 0x3a)) {
                    puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar19,end,4);
                  }
                  else {
                    puVar20 = (ulong *)(pbVar19 + 1);
                    if ((long)end - (long)puVar20 < 2) {
LAB_00118492:
                      puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                    }
                    else if ((char)(byte)*puVar20 < '!') {
                      if (((byte)*puVar20 != 0x20) || ((char)pbVar19[2] < '!')) goto LAB_00118492;
                      puVar20 = (ulong *)(pbVar19 + 2);
                    }
                  }
                  if (puVar1 != puVar20) {
                    sVar9 = 0;
                    fVar15 = 1;
                    type_parsers = Fantasy_Movie_parse_json_table::symbolic_parsers_3;
                    goto LAB_001184ca;
                  }
                }
              }
            }
            else if (((uVar6 & 0xffffffffffff0000) == 0x7261637465720000) && (6 < (long)uVar7)) {
              bVar2 = *(byte *)((long)puVar18 + 0xe);
              if (ctx->unquoted == 0) {
                if (bVar2 == 0x22) {
                  pbVar19 = (byte *)((long)puVar18 + 0xf);
                  goto LAB_00118109;
                }
              }
              else if ((char)bVar2 < '!' || bVar2 == 0x3a) {
                pbVar19 = (byte *)((long)puVar18 + 0xe);
                ctx->unquoted = 0;
LAB_00118109:
                if ((long)end - (long)pbVar19 < 2) {
LAB_001181bd:
                  pbVar19 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar19,end);
                }
                else if ((char)*pbVar19 < '!') {
                  if ((*pbVar19 != 0x20) || ((char)pbVar19[1] < '!')) goto LAB_001181bd;
                  pbVar19 = pbVar19 + 1;
                }
                if ((pbVar19 == (byte *)end) || (*pbVar19 != 0x3a)) {
                  puVar20 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar19,end,4);
                }
                else {
                  puVar20 = (ulong *)(pbVar19 + 1);
                  if ((long)end - (long)puVar20 < 2) {
LAB_00118427:
                    puVar20 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar20,end);
                  }
                  else if ((char)(byte)*puVar20 < '!') {
                    if (((byte)*puVar20 != 0x20) || ((char)pbVar19[2] < '!')) goto LAB_00118427;
                    puVar20 = (ulong *)(pbVar19 + 2);
                  }
                }
                if (puVar1 != puVar20) {
                  sVar9 = 0;
                  fVar15 = 1;
                  goto LAB_00118058;
                }
              }
            }
          }
switchD_00117597_default:
          pcVar5 = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar20,end);
        }
LAB_001184e7:
        buf = flatcc_json_parser_object_end(ctx,pcVar5,end,&more);
      }
    }
    else if (*buf < '!') {
      if ((*buf != 0x20) || ((char)*(byte *)((long)puVar18 + 2) < '!')) goto LAB_00118541;
      buf = (char *)((long)puVar18 + 2);
    }
  }
  if (ctx->error == 0) {
    buf = flatcc_json_parser_finalize_unions(ctx,buf,end,h_unions);
    fVar4 = flatcc_builder_end_table(ctx->ctx);
    *result = fVar4;
    if (fVar4 != 0) {
      return (char *)(ulong *)buf;
    }
  }
LAB_00117240:
  pcVar5 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar5;
}

Assistant:

static const char *Fantasy_Movie_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;
    size_t h_unions;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 10)) goto failed;
    if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, 5, &h_unions)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6368617261637465) { /* branch "characte" */
            if (w == 0x616e7461676f6e69) { /* descend "antagoni" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x73745f7479706500) { /* "st_type" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                    if (mark != buf) {
                        static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                Fantasy_Character_parse_json_enum,
                                monster_test_local_Fantasy_json_parser_enum,
                                monster_test_global_json_parser_enum, 0 };
                        buf = flatcc_json_parser_union_type(ctx, buf, end, 1, 3, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "st_type" */
                    if ((w & 0xffff000000000000) == 0x7374000000000000) { /* "st" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union(ctx, buf, end, 1, 3, h_unions, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "st" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "st" */
                } /* "st_type" */
            } else { /* descend "antagoni" */
                if (w == 0x63616d656f5f7479) { /* descend "cameo_ty" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffff000000000000) == 0x7065000000000000) { /* "pe" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    Fantasy_Character_parse_json_enum,
                                    monster_test_local_Fantasy_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type(ctx, buf, end, 3, 7, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "pe" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "pe" */
                } else { /* descend "cameo_ty" */
                    if ((w & 0xffffffffff000000) == 0x63616d656f000000) { /* "cameo" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union(ctx, buf, end, 3, 7, h_unions, Fantasy_Character_parse_json_union);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "cameo" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "cameo" */
                } /* descend "cameo_ty" */
            } /* descend "antagoni" */
        } else { /* branch "characte" */
            if (w < 0x6d61696e5f636861) { /* branch "main_cha" */
                if (w == 0x6368617261637465) { /* descend "characte" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffffffffff00) == 0x72735f7479706500) { /* "rs_type" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    Fantasy_Character_parse_json_enum,
                                    monster_test_local_Fantasy_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type_vector(ctx, buf, end, 4, 9, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union, Fantasy_Character_json_union_accept_type);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "rs_type" */
                        if ((w & 0xffff000000000000) == 0x7273000000000000) { /* "rs" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                            if (mark != buf) {
                                buf = flatcc_json_parser_union_vector(ctx, buf, end, 4, 9, h_unions, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "rs" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "rs" */
                    } /* "rs_type" */
                } else { /* descend "characte" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* descend "characte" */
            } else { /* branch "main_cha" */
                if (w == 0x6d61696e5f636861) { /* descend "main_cha" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if (w == 0x7261637465725f74) { /* descend "racter_t" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffff0000000000) == 0x7970650000000000) { /* "ype" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                            if (mark != buf) {
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        Fantasy_Character_parse_json_enum,
                                        monster_test_local_Fantasy_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                buf = flatcc_json_parser_union_type(ctx, buf, end, 0, 1, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "ype" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "ype" */
                    } else { /* descend "racter_t" */
                        if ((w & 0xffffffffffff0000) == 0x7261637465720000) { /* "racter" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                            if (mark != buf) {
                                buf = flatcc_json_parser_union(ctx, buf, end, 0, 1, h_unions, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "racter" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "racter" */
                    } /* descend "racter_t" */
                } else { /* descend "main_cha" */
                    if (w == 0x736964655f6b6963) { /* descend "side_kic" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffffffffff0000) == 0x6b5f747970650000) { /* "k_type" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                            if (mark != buf) {
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        Fantasy_Character_parse_json_enum,
                                        monster_test_local_Fantasy_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                buf = flatcc_json_parser_union_type(ctx, buf, end, 2, 5, h_unions, symbolic_parsers, Fantasy_Character_parse_json_union);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "k_type" */
                            if ((w & 0xff00000000000000) == 0x6b00000000000000) { /* "k" */
                                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                                if (mark != buf) {
                                    buf = flatcc_json_parser_union(ctx, buf, end, 2, 5, h_unions, Fantasy_Character_parse_json_union);
                                } else {
                                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                                }
                            } else { /* "k" */
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            } /* "k" */
                        } /* "k_type" */
                    } else { /* descend "side_kic" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* descend "side_kic" */
                } /* descend "main_cha" */
            } /* branch "main_cha" */
        } /* branch "characte" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}